

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::parse(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  byte __c;
  bool bVar1;
  uint uVar2;
  Cell CVar3;
  Cell CVar4;
  Cell CVar5;
  Cell CVar6;
  int iVar7;
  CAddr Value;
  uint uVar8;
  bool bVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ForthStack<unsigned_int> *local_38;
  
  requireDStackDepth(this,1,"PARSE");
  requireDStackAvailable(this,1,"PARSE");
  local_38 = &this->dStack;
  uVar2 = ForthStack<unsigned_int>::getTop(local_38);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  bVar9 = false;
  do {
    while( true ) {
      CVar3 = dataSpaceAtCell(this,this->VarOffsetSourceSize);
      CVar4 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
      if (CVar3 != CVar4 || (uVar2 & 0xff) != 0x29) break;
      bVar1 = refillNextLine(this);
      bVar9 = (bool)(!bVar1 | bVar9);
    }
    CVar5 = dataSpaceAtCell(this,this->VarOffsetSourceSize);
    CVar6 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
    if (0 < (int)(CVar5 - CVar6)) {
      CVar5 = dataSpaceAtCell(this,this->VarOffsetSourceAddress);
      CVar6 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
      __c = dataSpaceAt(this,CVar6 + CVar5);
      incSourceBufferOffset(this);
      if ((((uVar2 & 0xff) == 0x20) && (iVar7 = isspace((uint)__c), iVar7 != 0)) ||
         ((int)(char)uVar2 == (uint)__c)) break;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&local_58,__c);
    }
    bVar1 = !bVar9;
    bVar9 = false;
  } while (CVar3 != CVar4 && bVar1);
  iVar7 = this->vmSegmentParseBufferCounter;
  uVar2 = iVar7 + 1;
  uVar8 = iVar7 + 4;
  if (-1 < (int)uVar2) {
    uVar8 = uVar2;
  }
  this->vmSegmentParseBufferCounter = uVar2;
  Value = setVirtualMemory(this,&local_58,(iVar7 - (uVar8 & 0xfffffffc)) + 4);
  this_00 = local_38;
  ForthStack<unsigned_int>::setTop(local_38,Value);
  ForthStack<unsigned_int>::push(this_00,(uint)local_58._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void parse() {
			REQUIRE_DSTACK_DEPTH(1, "PARSE");
			REQUIRE_DSTACK_AVAILABLE(1, "PARSE");

			auto delim = static_cast<char>(dStack.getTop());
			/****

			I need a buffer to store the result of the Forth `PARSE` word.  Unlike `WORD`,
			this is a "normal" string and I won't need to store the count at the beginning
			of this buffer.

			****/

			std::string parseBuffer{};
			parseBuffer.clear();
			// Copy characters until we see the delimiter.

			bool exits{ false };
			while (!exits){
				while (getSourceBufferRemain()==0){ 
					// load next string from input buffer
					if (delim == ')') {
						auto flag=refillNextLine();
						if (!flag) {
							exits = true;							
						}
					}
					else {
						exits = true;
						break;
					}
				}
				if (getSourceBufferRemain() > 0) {
					// next char
					auto ch = getDataChar(getSourceAddress() + getSourceBufferOffset());
					incSourceBufferOffset();
					if ((delim == ' ' && isspace(static_cast<unsigned char>(ch))) || (delim == ch)) {
						exits = true;
					}
					else {
						parseBuffer.push_back(ch);
					}
				}
			}
			auto dataInDataSpace_ = PutStringToEndOfDataSpace(parseBuffer);

			dStack.setTop(CELL(dataInDataSpace_));
			push(static_cast<Cell>(parseBuffer.size()));
		}